

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  word wVar6;
  uint uVar7;
  word *pwVar8;
  long lVar9;
  int iVar10;
  
  if (iPivot < 0) {
LAB_00536c6e:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar7 = iPivot * 2;
  uVar1 = (p->vTimArrs).nSize;
  if (uVar1 == uVar7 || SBORROW4(uVar1,uVar7) != (int)(uVar1 + iPivot * -2) < 0) {
LAB_00536c8d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar5 = (p->vTimArrs).pArray;
  iVar10 = piVar5[uVar7];
  iVar2 = piVar5[(ulong)uVar7 + 1];
  if (iVar2 < iVar10) {
    iVar2 = iVar10;
  }
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  (p->vSortData).nSize = 0;
  if (vNodes->nSize < 1) {
    pwVar8 = (p->vSortData).pArray;
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    lVar9 = 0;
    do {
      uVar1 = vNodes->pArray[lVar9];
      if ((int)uVar1 < 0) goto LAB_00536c6e;
      if ((p->vTimArrs).nSize <= (int)(uVar1 * 2)) goto LAB_00536c8d;
      piVar5 = (p->vTimArrs).pArray;
      iVar3 = piVar5[(ulong)uVar1 * 2];
      iVar4 = piVar5[(ulong)uVar1 * 2 + 1];
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      if (0x3b9ac9fe < iVar4 + 499999999U) {
        __assert_fail("-ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                      ,0x15b,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
      }
      if (iVar10 == (p->vSortData).nCap) {
        if (iVar10 < 0x10) {
          pwVar8 = (p->vSortData).pArray;
          if (pwVar8 == (word *)0x0) {
            pwVar8 = (word *)malloc(0x80);
          }
          else {
            pwVar8 = (word *)realloc(pwVar8,0x80);
          }
          (p->vSortData).pArray = pwVar8;
          if (pwVar8 == (word *)0x0) {
LAB_00536ccb:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          (p->vSortData).nCap = 0x10;
        }
        else {
          pwVar8 = (p->vSortData).pArray;
          __size = (ulong)(uint)(iVar10 * 2) * 8;
          if (pwVar8 == (word *)0x0) {
            pwVar8 = (word *)malloc(__size);
          }
          else {
            pwVar8 = (word *)realloc(pwVar8,__size);
          }
          (p->vSortData).pArray = pwVar8;
          if (pwVar8 == (word *)0x0) goto LAB_00536ccb;
          (p->vSortData).nCap = iVar10 * 2;
        }
      }
      else {
        pwVar8 = (p->vSortData).pArray;
      }
      iVar3 = (p->vSortData).nSize;
      iVar10 = iVar3 + 1;
      (p->vSortData).nSize = iVar10;
      pwVar8[iVar3] = CONCAT44(uVar1,iVar4 + 500000000);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vNodes->nSize);
  }
  Abc_QuickSort3(pwVar8,iVar10,0);
  vNodes->nSize = 0;
  if ((p->vSortData).nSize < 1) {
    iVar10 = -1;
  }
  else {
    iVar10 = -1;
    lVar9 = 0;
    do {
      wVar6 = (p->vSortData).pArray[lVar9];
      Vec_IntPush(vNodes,(int)(wVar6 >> 0x20));
      if (iVar10 == -1) {
        iVar10 = -1;
        if (iVar2 + 500000000 < (int)wVar6 + p->DeltaCrit) {
          iVar10 = (int)lVar9;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vSortData).nSize);
  }
  return iVar10;
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, Time, nDivNew = -1; 
    int MaxDelay = ABC_INFINITY/2+Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
    {
        Time = Sfm_TimArrMaxId( p, Id );
        assert( -ABC_INFINITY/2 < Time && Time < ABC_INFINITY/2 );
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | (ABC_INFINITY/2+Time) );
    }
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}